

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileContext.cpp
# Opt level: O2

CompileResult __thiscall enact::CompileContext::compile(CompileContext *this,string *source)

{
  ostream *poVar1;
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ast;
  string local_88;
  AstSerialise serialise;
  
  std::__cxx11::string::operator=((string *)this,(string *)source);
  Parser::parse(&ast,&this->m_parser);
  serialise.m_ident._M_string_length = 0;
  serialise.m_ident.field_2._M_allocated_capacity = 0;
  serialise._16_8_ = 0;
  serialise.m_ident._M_dataplus._M_p = (pointer)0x0;
  serialise.
  super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       = (AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )0x0;
  serialise._1_7_ = 0;
  serialise._8_8_ = 0;
  serialise.m_ident.field_2._8_8_ = 0;
  AstSerialise::AstSerialise(&serialise);
  do {
    AstSerialise::operator()[abi_cxx11_
              (&local_88,&serialise,
               ((ast.
                 super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<enact::Stmt,_std::default_delete<enact::Stmt>_>._M_t.
               super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>.
               super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_88);
    std::operator<<(poVar1,'\n');
    std::__cxx11::string::~string((string *)&local_88);
    ast.
    super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         ast.
         super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
  } while( true );
}

Assistant:

CompileResult CompileContext::compile(std::string source) {
        m_source = std::move(source);

        std::vector<std::unique_ptr<Stmt>> ast = m_parser.parse();
        // TODO: serialise and print AST

        AstSerialise serialise{};
        for (const std::unique_ptr<Stmt>& stmt : ast) {
            std::cout << serialise(*stmt) << '\n';
        }
    }